

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinDiff.cc
# Opt level: O2

void print_binary_diff(FILE *stream,void *data1v,size_t size1,void *data2v,size_t size2,
                      bool use_color,size_t context_lines,uint64_t base_offset)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint16_t diff_flags;
  uint uVar10;
  size_t z;
  size_t sVar11;
  bool bVar12;
  bool use_color_local;
  int offset_width_digits;
  size_t local_b8;
  FILE *stream_local;
  ulong local_a8;
  ulong local_a0;
  uint8_t *data2;
  uint8_t *data1;
  size_t size2_local;
  size_t size1_local;
  anon_class_40_5_ac5c238a print_diff_line_pair;
  anon_class_32_4_ace858be print_diff_line;
  
  sVar5 = size2;
  if (size2 < size1) {
    sVar5 = size1;
  }
  uVar2 = base_offset + sVar5;
  if (uVar2 < 0x100000001) {
    if (uVar2 < 0x10001) {
      if (uVar2 < 0x101) {
        offset_width_digits = 2;
      }
      else {
        offset_width_digits = 4;
      }
    }
    else {
      offset_width_digits = 8;
    }
  }
  else {
    offset_width_digits = 0x10;
  }
  print_diff_line.use_color = &use_color_local;
  print_diff_line_pair.print_diff_line = &print_diff_line;
  print_diff_line.stream = &stream_local;
  print_diff_line.base_offset = &base_offset;
  print_diff_line.offset_width_digits = &offset_width_digits;
  print_diff_line_pair.data1 = &data1;
  print_diff_line_pair.size1 = &size1_local;
  print_diff_line_pair.size2 = &size2_local;
  print_diff_line_pair.data2 = &data2;
  sVar11 = ~context_lines;
  local_a0 = sVar5 + 0xf >> 4;
  uVar2 = 0;
  use_color_local = use_color;
  stream_local = stream;
  data2 = (uint8_t *)data2v;
  data1 = (uint8_t *)data1v;
  size2_local = size2;
  size1_local = size1;
  do {
LAB_00105a2d:
    uVar6 = uVar2 << 4;
    uVar7 = uVar2;
    while( true ) {
      sVar5 = uVar7;
      local_a8 = uVar2;
      if (sVar5 == local_a0) {
        if (uVar2 < local_a0) {
          fwrite("  ...\n",6,1,(FILE *)stream_local);
        }
        return;
      }
      bVar3 = 0;
      lVar8 = 0x10;
      uVar10 = 0;
      uVar7 = uVar6;
      while (bVar12 = lVar8 != 0, lVar8 = lVar8 + -1, bVar12) {
        uVar1 = 0xffff;
        uVar4 = 0xffff;
        if (uVar7 < size1_local) {
          uVar4 = (uint)data1[uVar7];
        }
        if (uVar7 < size2_local) {
          uVar1 = (uint)data2[uVar7];
        }
        uVar9 = 1 << (bVar3 & 0x1f);
        if (uVar4 == uVar1) {
          uVar9 = 0;
        }
        uVar10 = uVar10 | uVar9;
        uVar7 = uVar7 + 1;
        bVar3 = bVar3 + 1;
      }
      local_b8 = sVar5;
      if ((uint16_t)uVar10 != 0) break;
      if ((long)sVar5 <= (long)(sVar11 + context_lines)) goto LAB_00105abc;
      uVar6 = uVar6 + 0x10;
      uVar7 = sVar5 + 1;
    }
    if (uVar2 + context_lines < sVar5) {
      fwrite("  ...\n",6,1,(FILE *)stream_local);
      uVar2 = sVar5 - context_lines;
    }
    for (; sVar11 = local_b8, uVar2 < local_b8; uVar2 = uVar2 + 1) {
      print_binary_diff::anon_class_40_5_ac5c238a::operator()(&print_diff_line_pair,uVar2,0);
    }
    print_binary_diff::anon_class_40_5_ac5c238a::operator()
              (&print_diff_line_pair,local_b8,(uint16_t)uVar10);
    uVar2 = sVar11 + 1;
  } while( true );
LAB_00105abc:
  print_binary_diff::anon_class_40_5_ac5c238a::operator()(&print_diff_line_pair,sVar5,0);
  uVar2 = sVar5 + 1;
  goto LAB_00105a2d;
}

Assistant:

void print_binary_diff(
    FILE* stream,
    const void* data1v,
    size_t size1,
    const void* data2v,
    size_t size2,
    bool use_color,
    size_t context_lines,
    uint64_t base_offset = 0) {
  const uint8_t* data1 = reinterpret_cast<const uint8_t*>(data1v);
  const uint8_t* data2 = reinterpret_cast<const uint8_t*>(data2v);

  size_t max_data_size = std::max<size_t>(size1, size2);
  int offset_width_digits;
  if (base_offset + max_data_size > 0x100000000) {
    offset_width_digits = 16;
  } else if (base_offset + max_data_size > 0x10000) {
    offset_width_digits = 8;
  } else if (base_offset + max_data_size > 0x100) {
    offset_width_digits = 4;
  } else {
    offset_width_digits = 2;
  }

  auto print_diff_line = [&](char left_ch,
                             const uint8_t* data,
                             size_t size,
                             size_t line_index,
                             uint16_t diff_flags,
                             TerminalFormat color) {
    size_t line_start_offset = line_index * 0x10;
    if (use_color) {
      print_color_escape(stream, color, TerminalFormat::END);
    }
    uint64_t address = base_offset + line_start_offset;
    fprintf(stream, "%c %0*" PRIX64 " |", left_ch, offset_width_digits, address);
    for (size_t within_line_offset = 0; within_line_offset < 0x10; within_line_offset++) {
      size_t offset = (line_index * 0x10) + within_line_offset;
      if (offset < size) {
        if (use_color && (diff_flags & (1 << within_line_offset))) {
          print_color_escape(stream, color, TerminalFormat::BOLD, TerminalFormat::END);
          fprintf(stream, " %02hhX", data[offset]);
          print_color_escape(stream, TerminalFormat::NORMAL, color, TerminalFormat::END);
        } else {
          fprintf(stream, " %02hhX", data[offset]);
        }
      } else {
        fprintf(stream, "   ");
      }
    }
    fprintf(stream, " | ");
    for (size_t within_line_offset = 0; within_line_offset < 0x10; within_line_offset++) {
      size_t offset = (line_index * 0x10) + within_line_offset;
      if (offset < size) {
        char ch = data[offset];
        if (ch < 0x20 || ch > 0x7E) {
          ch = ' ';
        }
        if (use_color && (diff_flags & (1 << within_line_offset))) {
          print_color_escape(stream, color, TerminalFormat::BOLD, TerminalFormat::END);
          fputc(ch, stream);
          print_color_escape(stream, TerminalFormat::NORMAL, color, TerminalFormat::END);
        } else {
          fputc(ch, stream);
        }
      } else {
        fputc(' ', stream);
      }
    }
    if (use_color) {
      print_color_escape(stream, TerminalFormat::NORMAL, TerminalFormat::END);
    }
    fputc('\n', stream);
  };

  auto print_diff_line_pair = [&](size_t line_index, uint16_t diff_flags) -> void {
    size_t line_start_offset = line_index * 0x10;
    if (diff_flags == 0) {
      print_diff_line(' ', data1, size1, line_index, diff_flags, TerminalFormat::NORMAL);
    } else {
      if (line_start_offset < size1) {
        print_diff_line('-', data1, size1, line_index, diff_flags, TerminalFormat::FG_RED);
      }
      if (line_start_offset < size2) {
        print_diff_line('+', data2, size2, line_index, diff_flags, TerminalFormat::FG_GREEN);
      }
    }
  };

  size_t first_unprinted_line_index = 0;
  ssize_t last_different_line_index = -(context_lines + 1);
  size_t num_lines = ((max_data_size + 0x0F) >> 4);
  for (size_t line_index = 0; line_index < num_lines; line_index++) {
    uint16_t diff_flags = 0;
    for (size_t within_line_offset = 0; within_line_offset < 0x10; within_line_offset++) {
      size_t offset = (line_index * 0x10) + within_line_offset;
      uint16_t data1_value = (offset < size1) ? static_cast<uint8_t>(data1[offset]) : 0xFFFF;
      uint16_t data2_value = (offset < size2) ? static_cast<uint8_t>(data2[offset]) : 0xFFFF;
      if (data1_value != data2_value) {
        diff_flags |= (1 << within_line_offset);
      }
    }
    if (diff_flags == 0) {
      if (static_cast<ssize_t>(line_index) <= last_different_line_index + static_cast<ssize_t>(context_lines)) {
        print_diff_line_pair(line_index, diff_flags);
        first_unprinted_line_index = line_index + 1;
      }

    } else {
      bool has_unprinted_gap;
      size_t chunk_start_line_index;
      if ((first_unprinted_line_index + context_lines) >= line_index) {
        chunk_start_line_index = first_unprinted_line_index;
        has_unprinted_gap = false;
      } else {
        chunk_start_line_index = line_index - context_lines;
        has_unprinted_gap = true;
      }

      if (has_unprinted_gap) {
        fprintf(stream, "  ...\n");
      }

      for (size_t z = chunk_start_line_index; z < line_index; z++) {
        print_diff_line_pair(z, 0x0000);
      }
      print_diff_line_pair(line_index, diff_flags);
      first_unprinted_line_index = line_index + 1;
      last_different_line_index = line_index;
    }
  }

  if (first_unprinted_line_index < num_lines) {
    fprintf(stream, "  ...\n");
  }
}